

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O0

void __thiscall
icu_63::anon_unknown_4::SortKeyLevel::appendReverseWeight16(SortKeyLevel *this,uint32_t w)

{
  int iVar1;
  uchar uVar2;
  uchar uVar3;
  UBool UVar4;
  int iVar5;
  int32_t iVar6;
  uchar *puVar7;
  int32_t appendLength;
  uint8_t b1;
  uint8_t b0;
  uint32_t w_local;
  SortKeyLevel *this_local;
  
  uVar2 = (uchar)(w >> 8);
  uVar3 = (uchar)w;
  iVar5 = 2;
  if (uVar3 == '\0') {
    iVar5 = 1;
  }
  iVar1 = this->len;
  iVar6 = MaybeStackArray<unsigned_char,_40>::getCapacity(&this->buffer);
  if ((iVar1 + iVar5 <= iVar6) || (UVar4 = ensureCapacity(this,iVar5), UVar4 != '\0')) {
    if (uVar3 == '\0') {
      iVar5 = this->len;
      this->len = iVar5 + 1;
      puVar7 = MaybeStackArray<unsigned_char,_40>::operator[](&this->buffer,(long)iVar5);
      *puVar7 = uVar2;
    }
    else {
      puVar7 = MaybeStackArray<unsigned_char,_40>::operator[](&this->buffer,(long)this->len);
      *puVar7 = uVar3;
      puVar7 = MaybeStackArray<unsigned_char,_40>::operator[](&this->buffer,(long)(this->len + 1));
      *puVar7 = uVar2;
      this->len = this->len + 2;
    }
  }
  return;
}

Assistant:

void
SortKeyLevel::appendReverseWeight16(uint32_t w) {
    U_ASSERT((w & 0xffff) != 0);
    uint8_t b0 = (uint8_t)(w >> 8);
    uint8_t b1 = (uint8_t)w;
    int32_t appendLength = (b1 == 0) ? 1 : 2;
    if((len + appendLength) <= buffer.getCapacity() || ensureCapacity(appendLength)) {
        if(b1 == 0) {
            buffer[len++] = b0;
        } else {
            buffer[len] = b1;
            buffer[len + 1] = b0;
            len += 2;
        }
    }
}